

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::
BasicResult<Catch::clara::detail::ParseResultType>
          (BasicResult<Catch::clara::detail::ParseState> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *other)

{
  Type TVar1;
  BasicResult<Catch::clara::detail::ParseResultType> *in_RSI;
  BasicResult<Catch::clara::detail::ParseState> *in_RDI;
  ResultValueBase<Catch::clara::detail::ParseState> *in_stack_ffffffffffffffe0;
  
  detail::BasicResult<Catch::clara::detail::ParseResultType>::type(in_RSI);
  ResultValueBase<Catch::clara::detail::ParseState>::ResultValueBase
            (in_stack_ffffffffffffffe0,(Type)((ulong)in_RDI >> 0x20));
  (in_RDI->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_004d4a60;
  detail::BasicResult<Catch::clara::detail::ParseResultType>::errorMessage_abi_cxx11_
            ((BasicResult<Catch::clara::detail::ParseResultType> *)in_RDI);
  TVar1 = type(in_RDI);
  if (TVar1 != Ok) {
    return;
  }
  __assert_fail("type() != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                ,0x232b,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::clara::detail::ParseState, U = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }